

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaB_assert(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  iVar1 = lua_toboolean(L,1);
  if (iVar1 == 0) {
    pcVar2 = luaL_optlstring(L,2,"assertion failed!",(size_t *)0x0);
    L_local._4_4_ = luaL_error(L,"%s",pcVar2);
  }
  else {
    L_local._4_4_ = lua_gettop(L);
  }
  return L_local._4_4_;
}

Assistant:

static int luaB_assert(lua_State*L){
luaL_checkany(L,1);
if(!lua_toboolean(L,1))
return luaL_error(L,"%s",luaL_optstring(L,2,"assertion failed!"));
return lua_gettop(L);
}